

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QList<QDockWidget_*> * __thiscall
QMainWindowLayout::tabifiedDockWidgets(QMainWindowLayout *this,QDockWidget *dockWidget)

{
  long lVar1;
  QMainWindowTabBar *pQVar2;
  QMainWindowLayout *in_RSI;
  QMainWindowTabBar *in_RDI;
  long in_FS_OFFSET;
  QMainWindowTabBar *bar;
  QList<QDockWidget_*> *buddies;
  QDockWidget **in_stack_ffffffffffffffb8;
  QMainWindowTabBar *this_00;
  QDockWidget *in_stack_ffffffffffffffd8;
  QMainWindowTabBar *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RDI;
  pQVar2 = findTabBar(in_RSI,in_stack_ffffffffffffffd8);
  if (pQVar2 == (QMainWindowTabBar *)0x0) {
    memset(this_00,0,0x18);
    QList<QDockWidget_*>::QList((QList<QDockWidget_*> *)0x5f80b9);
  }
  else {
    *(Data **)&(this_00->super_QTabBar).super_QWidget = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(this_00->super_QTabBar).super_QWidget.field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(this_00->super_QTabBar).super_QWidget.super_QPaintDevice =
         &DAT_aaaaaaaaaaaaaaaa;
    QMainWindowTabBar::dockWidgets(this_01);
    QList<QDockWidget*>::removeOne<QDockWidget_const*>
              ((QList<QDockWidget_*> *)this_00,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QDockWidget_*> *)in_RDI;
}

Assistant:

QList<QDockWidget *> QMainWindowLayout::tabifiedDockWidgets(const QDockWidget *dockWidget) const
{
    const auto *bar = findTabBar(dockWidget);
    if (!bar)
        return {};

    QList<QDockWidget *> buddies = bar->dockWidgets();
    // Return only other dock widgets associated with dockWidget in a tab bar.
    // If dockWidget is alone in a tab bar, return an empty list.
    buddies.removeOne(dockWidget);
    return buddies;
}